

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

CK_RV __thiscall Token::setUserPIN(Token *this,ByteString *oldPIN,ByteString *newPIN)

{
  ObjectStoreToken *pOVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  SecureDataManager *this_00;
  CK_RV CVar6;
  CK_ULONG flags;
  ByteString userPINBlob;
  ByteString soPINBlob;
  MutexLocker lock;
  ulong local_c0;
  ByteString local_b8;
  ByteString local_90;
  MutexLocker local_68;
  ByteString local_58;
  
  MutexLocker::MutexLocker(&local_68,this->tokenMutex);
  CVar6 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    bVar2 = SecureDataManager::isUserLoggedIn(this->sdm);
    iVar5 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&local_c0);
    if ((char)iVar5 == '\0') {
      softHSMLog(3,"setUserPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x137,"Could not get the token flags");
    }
    else {
      this_00 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::getSOPINBlob(&local_90,this->sdm);
      SecureDataManager::getUserPINBlob(&local_b8,this->sdm);
      SecureDataManager::SecureDataManager(this_00,&local_90,&local_b8);
      local_b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_b8.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_90.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      bVar3 = SecureDataManager::loginUser(this_00,oldPIN);
      if (bVar3) {
        bVar3 = SecureDataManager::setUserPIN(this_00,newPIN);
        if (bVar3) {
          pOVar1 = this->token;
          SecureDataManager::getUserPINBlob(&local_58,this_00);
          iVar5 = (*pOVar1->_vptr_ObjectStoreToken[2])(pOVar1,&local_58);
          local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
          std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                    (&local_58.byteString.
                      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
          if ((char)iVar5 != '\0') {
            if (!bVar2) {
              SecureDataManager::logout(this_00);
            }
            if (this->sdm != (SecureDataManager *)0x0) {
              (*this->sdm->_vptr_SecureDataManager[1])();
            }
            this->sdm = this_00;
            ByteString::ByteString(&local_90);
            ByteString::ByteString(&local_b8);
            iVar5 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&local_90);
            if ((char)iVar5 == '\0') {
              uVar4 = false;
            }
            else {
              iVar5 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_b8);
              uVar4 = (undefined1)iVar5;
            }
            this->valid = (bool)uVar4;
            local_c0 = local_c0 & 0xfffffffffffeffff;
            (*this->token->_vptr_ObjectStoreToken[5])();
            local_b8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_b8.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            local_90._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
            std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                      (&local_90.byteString.
                        super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
            CVar6 = 0;
            goto LAB_00172665;
          }
        }
        (*this_00->_vptr_SecureDataManager[1])(this_00);
      }
      else {
        local_c0 = local_c0 | 0x10000;
        (*this->token->_vptr_ObjectStoreToken[5])();
        (*this_00->_vptr_SecureDataManager[1])(this_00);
        CVar6 = 0xa0;
      }
    }
  }
LAB_00172665:
  MutexLocker::~MutexLocker(&local_68);
  return CVar6;
}

Assistant:

CK_RV Token::setUserPIN(ByteString& oldPIN, ByteString& newPIN)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Check if user should stay logged in
	bool stayLoggedIn = sdm->isUserLoggedIn();

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Verify oldPIN
	SecureDataManager* newSdm = new SecureDataManager(sdm->getSOPINBlob(), sdm->getUserPINBlob());
	if (newSdm->loginUser(oldPIN) == false)
	{
		flags |= CKF_USER_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		delete newSdm;
		return CKR_PIN_INCORRECT;
	}

	// Set the new user PIN
	if (newSdm->setUserPIN(newPIN) == false)
	{
		delete newSdm;
		return CKR_GENERAL_ERROR;
	}

	// Save PIN to token file
	if (token->setUserPIN(newSdm->getUserPINBlob()) == false)
	{
		delete newSdm;
		return CKR_GENERAL_ERROR;
	}

	// Restore previous login state
	if (!stayLoggedIn) newSdm->logout();

	// Switch sdm
	delete sdm;
	sdm = newSdm;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	flags &= ~CKF_USER_PIN_COUNT_LOW;
	token->setTokenFlags(flags);

	return CKR_OK;
}